

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * cuddBddTransferRecur(DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table)

{
  int *piVar1;
  DdNode *pDVar2;
  int iVar3;
  DdNode *h;
  DdNode *pDVar4;
  long lVar5;
  ulong uVar6;
  int *key;
  DdNode *res;
  timespec ts;
  DdNode *local_60;
  DdNode *local_58;
  int local_4c;
  timespec local_48;
  DdNode *local_38;
  
  pDVar2 = ddD->one;
  key = (int *)((ulong)f & 0xfffffffffffffffe);
  uVar6 = (ulong)((uint)f & 1);
  if (*key == 0x7fffffff) {
    return (DdNode *)(uVar6 ^ (ulong)pDVar2);
  }
  iVar3 = st__lookup(table,(char *)key,(char **)&local_60);
  if (iVar3 == 0) {
    if (ddS->TimeStop != 0) {
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      if (ddS->TimeStop < lVar5) {
        return (DdNode *)0x0;
      }
    }
    if (ddD->TimeStop != 0) {
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      if (ddD->TimeStop < lVar5) {
        return (DdNode *)0x0;
      }
    }
    local_4c = *key;
    local_38 = *(DdNode **)(key + 6);
    local_58 = cuddBddTransferRecur(ddS,ddD,*(DdNode **)(key + 4),table);
    if (local_58 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)local_58 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      h = cuddBddTransferRecur(ddS,ddD,local_38,table);
      pDVar4 = local_58;
      if (h != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddUniqueInter(ddD,local_4c,pDVar2,(DdNode *)((ulong)pDVar2 ^ 1));
        pDVar2 = local_58;
        if ((pDVar4 == (DdNode *)0x0) ||
           (local_60 = cuddBddIteRecur(ddD,pDVar4,local_58,h), local_60 == (DdNode *)0x0)) {
          Cudd_RecursiveDeref(ddD,pDVar2);
          pDVar4 = h;
        }
        else {
          piVar1 = (int *)(((ulong)local_60 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(ddD,pDVar2);
          Cudd_RecursiveDeref(ddD,h);
          iVar3 = st__add_direct(table,(char *)key,(char *)local_60);
          pDVar4 = local_60;
          if (iVar3 != -10000) {
            return (DdNode *)(uVar6 ^ (ulong)local_60);
          }
        }
      }
      Cudd_RecursiveDeref(ddD,pDVar4);
    }
    return (DdNode *)0x0;
  }
  return (DdNode *)(uVar6 ^ (ulong)local_60);
}

Assistant:

static DdNode *
cuddBddTransferRecur(
  DdManager * ddS,
  DdManager * ddD,
  DdNode * f,
  st__table * table)
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int    index;
    int    comple = 0;

    statLine(ddD);
    one = DD_ONE(ddD);
    comple = Cudd_IsComplement(f);

    /* Trivial cases. */
    if (Cudd_IsConstant(f)) return(Cudd_NotCond(one, comple));

    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond(f,comple);
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup(table, (const char *)f, (char **)&res))
        return(Cudd_NotCond(res,comple));

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;
    
    /* Recursive step. */
    index = f->index;
    ft = cuddT(f); fe = cuddE(f);

    t = cuddBddTransferRecur(ddS, ddD, ft, table);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = cuddBddTransferRecur(ddS, ddD, fe, table);
    if (e == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        return(NULL);
    }
    cuddRef(e);

    zero = Cudd_Not(one);
    var = cuddUniqueInter(ddD,index,one,zero);
    if (var == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    res = cuddBddIteRecur(ddD,var,t,e);
    if (res == NULL) {
        Cudd_RecursiveDeref(ddD, t);
        Cudd_RecursiveDeref(ddD, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(ddD, t);
    Cudd_RecursiveDeref(ddD, e);

    if ( st__add_direct(table, (char *) f, (char *) res) == st__OUT_OF_MEM) {
        Cudd_RecursiveDeref(ddD, res);
        return(NULL);
    }
    return(Cudd_NotCond(res,comple));

}